

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O3

void ApplyAlphaMultiply_C(uint8_t *rgba,int alpha_first,int w,int h,int stride)

{
  bool bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  int iVar5;
  
  if (0 < h) {
    puVar4 = rgba + (ulong)(alpha_first != 0) + 2;
    puVar2 = rgba + (ulong)(alpha_first == 0) * 3;
    do {
      if (0 < w) {
        uVar3 = 0;
        do {
          if (puVar2[uVar3 * 4] != 0xff) {
            iVar5 = (uint)puVar2[uVar3 * 4] * 0x8081;
            puVar4[uVar3 * 4 + -2] = (uint8_t)((uint)puVar4[uVar3 * 4 + -2] * iVar5 >> 0x17);
            puVar4[uVar3 * 4 + -1] = (uint8_t)((uint)puVar4[uVar3 * 4 + -1] * iVar5 >> 0x17);
            puVar4[uVar3 * 4] = (uint8_t)((uint)puVar4[uVar3 * 4] * iVar5 >> 0x17);
          }
          uVar3 = uVar3 + 1;
        } while ((uint)w != uVar3);
      }
      puVar4 = puVar4 + stride;
      puVar2 = puVar2 + stride;
      bVar1 = 1 < h;
      h = h + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

static void ApplyAlphaMultiply_C(uint8_t* rgba, int alpha_first,
                                 int w, int h, int stride) {
  while (h-- > 0) {
    uint8_t* const rgb = rgba + (alpha_first ? 1 : 0);
    const uint8_t* const alpha = rgba + (alpha_first ? 0 : 3);
    int i;
    for (i = 0; i < w; ++i) {
      const uint32_t a = alpha[4 * i];
      if (a != 0xff) {
        const uint32_t mult = MULTIPLIER(a);
        rgb[4 * i + 0] = PREMULTIPLY(rgb[4 * i + 0], mult);
        rgb[4 * i + 1] = PREMULTIPLY(rgb[4 * i + 1], mult);
        rgb[4 * i + 2] = PREMULTIPLY(rgb[4 * i + 2], mult);
      }
    }
    rgba += stride;
  }
}